

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O2

int ffbinse(char *binspec,int *imagetype,int *histaxis,char (*colname) [71],double *minin,
           double *maxin,double *binsizein,char (*minname) [71],char (*maxname) [71],
           char (*binname) [71],double *wt,char *wtname,int *recip,char ***exprs,int *status)

{
  int iVar1;
  size_t sVar2;
  double *pdVar3;
  char *pcVar4;
  char **ppcVar5;
  char cVar6;
  char (*__dest) [71];
  char *pcVar7;
  long lVar8;
  long lVar9;
  double *pdVar10;
  char (*__dest_00) [71];
  double *local_128;
  char *local_120;
  char *file_expr;
  char *local_110;
  double *local_108;
  char *local_100;
  char (*local_f8) [71];
  int *local_f0;
  undefined4 local_e4;
  int *local_e0;
  char *exprend [5];
  char *exprbeg [5];
  double dummy;
  char tmpname [71];
  
  file_expr = (char *)0x0;
  exprbeg[4] = (char *)0x0;
  exprbeg[2] = (char *)0x0;
  exprbeg[3] = (char *)0x0;
  exprbeg[0] = (char *)0x0;
  exprbeg[1] = (char *)0x0;
  exprend[2] = (char *)0x0;
  exprend[3] = (char *)0x0;
  exprend[0] = (char *)0x0;
  exprend[1] = (char *)0x0;
  exprend[4] = (char *)0x0;
  if (exprs != (char ***)0x0) {
    *exprs = (char **)0x0;
  }
  if (0 < *status) {
    return *status;
  }
  *histaxis = 2;
  *imagetype = 0x1f;
  *wt = 1.0;
  *recip = 0;
  *wtname = '\0';
  lVar9 = 0;
  for (lVar8 = 0; lVar8 != 0x11c; lVar8 = lVar8 + 0x47) {
    (*colname)[lVar8] = '\0';
    (*minname)[lVar8] = '\0';
    (*maxname)[lVar8] = '\0';
    (*binname)[lVar8] = '\0';
    *(undefined8 *)((long)minin + lVar9) = 0xb8a83e285ebab4b7;
    *(undefined8 *)((long)maxin + lVar9) = 0xb8a83e285ebab4b7;
    *(undefined8 *)((long)binsizein + lVar9) = 0xb8a83e285ebab4b7;
    lVar9 = lVar9 + 8;
  }
  local_128 = (double *)(binspec + 3);
  cVar6 = binspec[3];
  local_e4 = 0x101;
  switch(cVar6) {
  case 'b':
    *imagetype = 0xb;
    break;
  case 'c':
  case 'e':
  case 'f':
  case 'g':
  case 'h':
    goto switchD_0016e80d_caseD_63;
  case 'd':
    *imagetype = 0x52;
    break;
  case 'i':
    *imagetype = 0x15;
    break;
  case 'j':
    break;
  default:
    if (cVar6 == 'r') {
      *imagetype = 0x2a;
      break;
    }
    goto switchD_0016e80d_caseD_63;
  }
  local_128 = (double *)(binspec + 4);
  cVar6 = *(char *)local_128;
  local_e4 = 0;
switchD_0016e80d_caseD_63:
  if (cVar6 == '\0') {
LAB_0016ef9d:
    iVar1 = *status;
  }
  else {
    if (cVar6 == ' ') {
      while (pdVar10 = (double *)((long)local_128 + 1), cVar6 == ' ') {
        local_128 = pdVar10;
        cVar6 = *(char *)pdVar10;
      }
      if (cVar6 == '\0') goto LAB_0016ef9d;
      local_120 = binspec;
      local_f0 = histaxis;
      local_e0 = imagetype;
      if (cVar6 == '@') {
        iVar1 = ffimport_file((char *)pdVar10,&file_expr,status);
        pdVar10 = (double *)file_expr;
        if (iVar1 != 0) {
          return *status;
        }
        do {
          local_128 = pdVar10;
          cVar6 = *(char *)local_128;
          pdVar10 = (double *)((long)local_128 + 1);
        } while (cVar6 == ' ');
      }
      pdVar10 = (double *)((long)pdVar10 + -1);
      if (cVar6 == '(') {
        pcVar4 = (char *)0x0;
        local_100 = file_expr;
        while (pcVar4 != (char *)0x4) {
          pdVar10 = (double *)((long)pdVar10 + 1);
          do {
            local_128 = pdVar10;
            pdVar10 = (double *)((long)local_128 + 1);
          } while (*(char *)local_128 == ' ');
          local_110 = pcVar4;
          local_108 = local_128;
          sVar2 = strcspn((char *)local_128," ,)");
          local_f8 = (char (*) [71])(long)(int)sVar2;
          strncat(colname[(long)local_110],(char *)local_108,(size_t)local_f8);
          pcVar4 = local_120;
          pdVar3 = (double *)((long)pdVar10 + (long)local_f8);
          for (pdVar10 = (double *)((char *)((long)pdVar10 + (long)local_f8) + -1);
              *(char *)pdVar10 == ' '; pdVar10 = (double *)((long)pdVar10 + 1)) {
            pdVar3 = (double *)((long)pdVar3 + 1);
          }
          local_128 = pdVar10;
          if (*(char *)pdVar10 == ')') {
            *local_f0 = (int)local_110 + 1;
            if (local_110 != (char *)0x4) goto LAB_0016eb14;
            break;
          }
          pcVar4 = local_110 + 1;
        }
        pcVar7 = "binning specification has too many column names or is missing closing \')\':";
        pcVar4 = local_120;
LAB_0016ec7c:
        ffpmsg(pcVar7);
LAB_0016ec84:
        ffpmsg(pcVar4);
        free(file_expr);
        goto LAB_0016e8be;
      }
      iVar1 = 0;
      pcVar4 = (char *)0x0;
      while (pcVar4 != (char *)0x4) {
        exprend[(long)pcVar4] = (char *)0x0;
        local_110 = (char *)CONCAT44(local_110._4_4_,iVar1);
        ppcVar5 = exprbeg + (long)pcVar4;
        *ppcVar5 = (char *)0x0;
        local_108 = binsizein + (long)pcVar4;
        local_f8 = minname + (long)pcVar4;
        local_100 = pcVar4;
        ffbinre((char **)&local_128,colname[(long)pcVar4],ppcVar5,exprend + (long)pcVar4,
                minin + (long)pcVar4,maxin + (long)pcVar4,local_108,*local_f8,maxname[(long)pcVar4],
                binname[(long)pcVar4],status);
        iVar1 = (int)local_110;
        if (*ppcVar5 != (char *)0x0) {
          iVar1 = 1;
        }
        if (0 < *status) {
          pcVar4 = "illegal syntax in binning range specification in URL:";
          goto LAB_0016eda5;
        }
        cVar6 = *(char *)local_128;
        if (cVar6 == ' ') {
          cVar6 = ' ';
          while (pdVar10 = (double *)((long)local_128 + 1), cVar6 == ' ') {
            local_128 = pdVar10;
            cVar6 = *(char *)pdVar10;
          }
          if ((cVar6 == '\0') || ((cVar6 != ',' && (pdVar10 = local_128, cVar6 == ';'))))
          goto LAB_0016eb9a;
        }
        else {
          if (cVar6 != ',') {
            if ((cVar6 != '\0') && (cVar6 != ';')) {
              pcVar7 = "illegal characters following binning specification in URL:";
              pcVar4 = local_120;
              goto LAB_0016ec7c;
            }
LAB_0016eb9a:
            *local_f0 = (int)local_100 + 1;
            if ((((((int)local_100 == 0) && ((*colname)[0] == '\0')) &&
                 (*minin == -9.1191291391491e-36)) &&
                ((!NAN(*minin) && (*maxin == -9.1191291391491e-36)))) && (!NAN(*maxin))) {
              *local_f0 = 2;
              binsizein[1] = *binsizein;
            }
            pdVar10 = local_128;
            if (*(char *)local_128 == ';') goto LAB_0016ebbd;
            goto LAB_0016edce;
          }
          pdVar10 = (double *)((long)local_128 + 1);
        }
        local_128 = pdVar10;
        pcVar4 = local_100 + 1;
      }
      ffpmsg("illegal binning specification in URL:");
      ffpmsg("apparently greater than 4 histogram dimensions");
      ffpmsg(local_120);
      *status = 0x7d;
    }
    else {
      ffpmsg("binning specification syntax error:");
      ffpmsg(binspec);
LAB_0016e8be:
      *status = 0x7d;
    }
    iVar1 = 0x7d;
  }
  return iVar1;
LAB_0016eb14:
  do {
    local_128 = pdVar3;
    cVar6 = *(char *)local_128;
    pdVar3 = (double *)((long)local_128 + 1);
  } while (cVar6 == ' ');
  pcVar7 = local_100;
  if (cVar6 == '\0') goto LAB_0016edb9;
  pdVar10 = (double *)((long)local_128 + 1);
  if (cVar6 != '=') {
    ffpmsg("illegal binning specification in URL:");
    pcVar7 = " an equals sign \'=\' must follow the column names";
    goto LAB_0016ec7c;
  }
  do {
    local_128 = pdVar10;
    pdVar10 = (double *)((long)local_128 + 1);
  } while (*(char *)local_128 == ' ');
  ffbinr((char **)&local_128,tmpname,minin,maxin,binsizein,*minname,*maxname,*binname,status);
  if (0 < *status) {
    pcVar4 = "illegal binning specification in URL:";
LAB_0016eda5:
    ffpmsg(pcVar4);
    ffpmsg(local_120);
    pcVar7 = file_expr;
LAB_0016edb9:
    free(pcVar7);
    return *status;
  }
  pdVar10 = (double *)0x1;
  __dest = binname;
  pcVar4 = *minname;
  __dest_00 = maxname;
  while( true ) {
    __dest_00 = __dest_00 + 1;
    __dest = __dest + 1;
    if ((long)*local_f0 <= (long)pdVar10) break;
    minin[(long)pdVar10] = *minin;
    maxin[(long)pdVar10] = *maxin;
    binsizein[(long)pdVar10] = *binsizein;
    local_110 = pcVar4 + 0x47;
    local_108 = pdVar10;
    strcpy(pcVar4 + 0x47,*minname);
    strcpy(*__dest_00,*maxname);
    strcpy(*__dest,*binname);
    pdVar10 = (double *)((long)local_108 + 1);
    pcVar4 = local_110;
  }
  for (; cVar6 = *(char *)local_128, cVar6 == ' '; local_128 = (double *)((long)local_128 + 1)) {
  }
  if (cVar6 != '\0') {
    if (cVar6 == ';') {
      iVar1 = 0;
LAB_0016ebbd:
      pdVar10 = (double *)((long)local_128 + 1);
      do {
        local_128 = pdVar10;
        pdVar10 = (double *)((long)local_128 + 1);
      } while (*(char *)local_128 == ' ');
      *recip = 0;
      if (*(char *)local_128 == '/') {
        *recip = 1;
        do {
          local_128 = pdVar10;
          pdVar10 = (double *)((long)local_128 + 1);
        } while (*(char *)local_128 == ' ');
      }
      exprend[4] = (char *)0x0;
      exprbeg[4] = (char *)0x0;
      ffbinre((char **)&local_128,wtname,exprbeg + 4,exprend + 4,&dummy,&dummy,wt,tmpname,tmpname,
              tmpname,status);
      if (exprbeg[4] != (char *)0x0) {
        iVar1 = 1;
      }
      if (*status < 1) {
        pdVar10 = local_128;
        if (((char)local_e4 != '\0') &&
           (((*wt != 1.0 || (NAN(*wt))) || (exprbeg[4] != (char *)0x0 || *wtname != '\0')))) {
          *local_e0 = 0x2a;
        }
LAB_0016edce:
        do {
          local_128 = pdVar10;
          pcVar4 = local_120;
          pdVar10 = (double *)((long)local_128 + 1);
        } while (*(char *)local_128 == ' ');
        if (*(char *)local_128 != '\0') {
          ffpmsg("illegal syntax after binning weight specification in URL:");
          ffpmsg(pcVar4);
          *status = 0x7d;
        }
        free(file_expr);
        if (iVar1 != 0) {
          pcVar4 = (char *)0x0;
          for (lVar8 = 0; lVar8 != 5; lVar8 = lVar8 + 1) {
            pcVar4 = exprend[lVar8] + (long)(pcVar4 + (1 - (long)exprbeg[lVar8]));
          }
          ppcVar5 = (char **)malloc((size_t)(pcVar4 + 0x28));
          if (ppcVar5 == (char **)0x0) {
            ffpmsg("ffbinse: memory allocation failure");
            *status = 0x71;
            return 0x71;
          }
          *exprs = ppcVar5;
          ppcVar5 = ppcVar5 + 5;
          for (lVar8 = 0; lVar8 != 5; lVar8 = lVar8 + 1) {
            (*exprs)[lVar8] = (char *)ppcVar5;
            sVar2 = (long)exprend[lVar8] - (long)exprbeg[lVar8];
            strncpy((char *)ppcVar5,exprbeg[lVar8],sVar2);
            pcVar4 = (char *)((long)ppcVar5 + sVar2);
            ppcVar5 = (char **)(pcVar4 + 1);
            *pcVar4 = '\0';
          }
        }
        return *status;
      }
      pcVar4 = "illegal binning weight specification in URL:";
      goto LAB_0016eda5;
    }
    ffpmsg("illegal syntax after binning range specification in URL:");
    pcVar4 = local_120;
    goto LAB_0016ec84;
  }
  goto LAB_0016ef9d;
}

Assistant:

int ffbinse(char *binspec,   /* I - binning specification */
                   int *imagetype,      /* O - image type, TINT or TSHORT */
                   int *histaxis,       /* O - no. of axes in the histogram */
                   char colname[4][FLEN_VALUE],  /* column name for axis */
                   double *minin,        /* minimum value for each axis */
                   double *maxin,        /* maximum value for each axis */
                   double *binsizein,    /* size of bins on each axis */
                   char minname[4][FLEN_VALUE],  /* keyword name for min */
                   char maxname[4][FLEN_VALUE],  /* keyword name for max */
                   char binname[4][FLEN_VALUE],  /* keyword name for binsize */
                   double *wt,          /* weighting factor          */
                   char *wtname,        /* keyword or column name for weight */
                   int *recip,          /* the reciprocal of the weight? */
	           char ***exprs,       /* returned with expressions (or 0) */
                   int *status)
{
/*
   Parse the extended input binning specification string, returning
   the binning parameters.  Supports up to 4 dimensions.  The binspec
   string has one of these forms:

   bin binsize                  - 2D histogram with binsize on each axis
   bin xcol                     - 1D histogram on column xcol
   bin (xcol, ycol) = binsize   - 2D histogram with binsize on each axis
   bin x=min:max:size, y=min:max:size, z..., t... 
   bin x=:max, y=::size
   bin x=size, y=min::size
   bin x(expr), y(expr)=min:max:size, ...

   most other reasonable combinations are supported. The (expr) is an 
   optional expression that will be calculated on the fly instead of
   a table column name.  The name is still used for the output pixel
   array metadata.

   If expr == 0, then expressions are forbidden.  The caller does not
   expect expressions.  

   If exprs is non-zero, then upon return an array of expressions is
   passed back to the caller.  Storage may be allocated by this routine,
   If *exprs is non-zero upon return, the caller is responsible to
   free(*exprs).  Upon return, the contains of exprs is,
       (*exprs)[0] = expression for column 1 (or 0 if none)
       (*exprs)[1] = expression for column 2 (or 0 if none)
       (*exprs)[2] = expression for column 3 (or 0 if none)
       (*exprs)[3] = expression for column 4 (or 0 if none)
       (*exprs)[4] = expression for weighting (or 0 if none)

   If the user specifies a column name and not an expression for bin
   axis i, then the corresponding (*exprs)[i] will be a null pointer.

   To be recognized as an expression, the weighting expression must be
   enclosed in parentheses.

   Expressions are never allowed using the bin (xcol,ycol) notation.

*/
    int ii, slen, defaulttype;
    char *ptr, tmpname[FLEN_VALUE], *file_expr = NULL;
    double  dummy;
    char *exprbeg[5] = {0}, *exprend[5] = {0};
    int has_exprs = 0;

    if (exprs) (*exprs) = 0; /* initialized output */

    if (*status > 0)
         return(*status);

    /* set the default values */
    *histaxis = 2;
    *imagetype = TINT;
    defaulttype = 1;
    *wt = 1.;
    *recip = 0;
    *wtname = '\0';

    /* set default values */
    for (ii = 0; ii < 4; ii++)
    {
        *colname[ii] = '\0';
        *minname[ii] = '\0';
        *maxname[ii] = '\0';
        *binname[ii] = '\0';
        minin[ii] = DOUBLENULLVALUE;  /* undefined values */
        maxin[ii] = DOUBLENULLVALUE;
        binsizein[ii] = DOUBLENULLVALUE;
    }

    ptr = binspec + 3;  /* skip over 'bin' */

    if (*ptr == 'i' )  /* bini */
    {
        *imagetype = TSHORT;
        defaulttype = 0;
        ptr++;
    }
    else if (*ptr == 'j' )  /* binj; same as default */
    {
        defaulttype = 0;
        ptr ++;
    }
    else if (*ptr == 'r' )  /* binr */
    {
        *imagetype = TFLOAT;
        defaulttype = 0;
        ptr ++;
    }
    else if (*ptr == 'd' )  /* bind */
    {
        *imagetype = TDOUBLE;
        defaulttype = 0;
        ptr ++;
    }
    else if (*ptr == 'b' )  /* binb */
    {
        *imagetype = TBYTE;
        defaulttype = 0;
        ptr ++;
    }

    if (*ptr == '\0')  /* use all defaults for other parameters */
        return(*status);
    else if (*ptr != ' ')  /* must be at least one blank */
    {
        ffpmsg("binning specification syntax error:");
        ffpmsg(binspec);
        return(*status = URL_PARSE_ERROR);
    }

    while (*ptr == ' ')  /* skip over blanks */
           ptr++;

    if (*ptr == '\0')   /* no other parameters; use defaults */
        return(*status);

    /* Check if need to import expression from a file */

    if( *ptr=='@' ) {
       if( ffimport_file( ptr+1, &file_expr, status ) ) return(*status);
       ptr = file_expr;
       while (*ptr == ' ')
               ptr++;       /* skip leading white space... again */
    }

    if (*ptr == '(' )
    {
        /* this must be the opening parenthesis around a list of column */
        /* names, optionally followed by a '=' and the binning spec. */

        for (ii = 0; ii < 4; ii++)
        {
            ptr++;               /* skip over the '(', ',', or ' ') */
            while (*ptr == ' ')  /* skip over blanks */
                ptr++;

            slen = strcspn(ptr, " ,)");
            strncat(colname[ii], ptr, slen); /* copy 1st column name */

            ptr += slen;
            while (*ptr == ' ')  /* skip over blanks */
                ptr++;

            if (*ptr == ')' )   /* end of the list of names */
            {
                *histaxis = ii + 1;
                break;
            }
        }

        if (ii == 4)   /* too many names in the list , or missing ')'  */
        {
            ffpmsg(
 "binning specification has too many column names or is missing closing ')':");
            ffpmsg(binspec);
	    if( file_expr ) free( file_expr );
            return(*status = URL_PARSE_ERROR);
        }

        ptr++;  /* skip over the closing parenthesis */
        while (*ptr == ' ')  /* skip over blanks */
            ptr++;

        if (*ptr == '\0') {
	    if( file_expr ) free( file_expr );
            return(*status);  /* parsed the entire string */
	}

        else if (*ptr != '=')  /* must be an equals sign now*/
        {
            ffpmsg("illegal binning specification in URL:");
            ffpmsg(" an equals sign '=' must follow the column names");
            ffpmsg(binspec);
	    if( file_expr ) free( file_expr );
            return(*status = URL_PARSE_ERROR);
        }

        ptr++;  /* skip over the equals sign */
        while (*ptr == ' ')  /* skip over blanks */
            ptr++;

        /* get the single range specification for all the columns */
	/* Note that the extended syntax is not allowed here */
        ffbinr(&ptr, tmpname, minin,
	       maxin, binsizein, minname[0],
	       maxname[0], binname[0], status);
        if (*status > 0)
        {
            ffpmsg("illegal binning specification in URL:");
            ffpmsg(binspec);
	    if( file_expr ) free( file_expr );
            return(*status);
        }

        for (ii = 1; ii < *histaxis; ii++)
        {
            minin[ii] = minin[0];
            maxin[ii] = maxin[0];
            binsizein[ii] = binsizein[0];
            strcpy(minname[ii], minname[0]);
            strcpy(maxname[ii], maxname[0]);
            strcpy(binname[ii], binname[0]);
        }

        while (*ptr == ' ')  /* skip over blanks */
            ptr++;

        if (*ptr == ';')
            goto getweight;   /* a weighting factor is specified */

        if (*ptr != '\0')  /* must have reached end of string */
        {
            ffpmsg("illegal syntax after binning range specification in URL:");
            ffpmsg(binspec);
	    if( file_expr ) free( file_expr );
            return(*status = URL_PARSE_ERROR);
        }

        return(*status);
    }             /* end of case with list of column names in ( )  */

    /* if we've reached this point, then the binning specification */
    /* must be of the form: XCOL = min:max:binsize, YCOL = ...     */
    /* where the column name followed by '=' are optional.         */
    /* If the column name is not specified, then use the default name */

    for (ii = 0; ii < 4; ii++) /* allow up to 4 histogram dimensions */
    {
        exprbeg[ii] = exprend[ii] = 0;
        ffbinre(&ptr, colname[ii], &(exprbeg[ii]), &(exprend[ii]),
		&minin[ii], &maxin[ii], &binsizein[ii], minname[ii],
		maxname[ii], binname[ii], status);
	/* Check for expressions */
	if (exprbeg[ii]) has_exprs = 1;
	
        if (*status > 0)
        {
            ffpmsg("illegal syntax in binning range specification in URL:");
            ffpmsg(binspec);
	    if( file_expr ) free( file_expr );
            return(*status);
        }

        if (*ptr == '\0' || *ptr == ';')
            break;        /* reached the end of the string */

        if (*ptr == ' ')
        {
            while (*ptr == ' ')  /* skip over blanks */
                ptr++;

            if (*ptr == '\0' || *ptr == ';')
                break;        /* reached the end of the string */

            if (*ptr == ',')
                ptr++;  /* comma separates the next column specification */
        }
        else if (*ptr == ',')
        {          
            ptr++;  /* comma separates the next column specification */
        }
        else
        {
            ffpmsg("illegal characters following binning specification in URL:");
            ffpmsg(binspec);
	    if( file_expr ) free( file_expr );
            return(*status = URL_PARSE_ERROR);
        }
    }

    if (ii == 4)
    {
        /* there are yet more characters in the string */
        ffpmsg("illegal binning specification in URL:");
        ffpmsg("apparently greater than 4 histogram dimensions");
        ffpmsg(binspec);
        return(*status = URL_PARSE_ERROR);
    }
    else
        *histaxis = ii + 1;

    /* special case: if a single number was entered it should be      */
    /* interpreted as the binning factor for the default X and Y axes */

    if (*histaxis == 1 && *colname[0] == '\0' && 
         minin[0] == DOUBLENULLVALUE && maxin[0] == DOUBLENULLVALUE)
    {
        *histaxis = 2;
        binsizein[1] = binsizein[0];
    }

getweight:
    if (*ptr == ';')  /* looks like a weighting factor is given */
    {
        ptr++;
       
        while (*ptr == ' ')  /* skip over blanks */
            ptr++;

        *recip = 0;
        if (*ptr == '/')
        {
            *recip = 1;  /* the reciprocal of the weight is entered */
            ptr++;

            while (*ptr == ' ')  /* skip over blanks */
                ptr++;
        }

        /* parse the weight as though it were a binrange. */
        /* either a column name or a numerical value will be returned */

        exprbeg[4] = exprend[4] = 0;
        ffbinre(&ptr, wtname, &(exprbeg[4]), &(exprend[4]),
		&dummy, &dummy, wt, tmpname,
		tmpname, tmpname, status);
	if (exprbeg[4]) has_exprs = 1;

        if (*status > 0)
        {
            ffpmsg("illegal binning weight specification in URL:");
            ffpmsg(binspec);
	    if( file_expr ) free( file_expr );
            return(*status);
        }

        /* creat a float datatype histogram by default, if weight */
        /* factor is not = 1.0  */

        if ( (defaulttype && *wt != 1.0) || 
	     (defaulttype && *wtname) ||
	     (defaulttype && exprbeg[4])) {
	  *imagetype = TFLOAT;
	}
    }

    while (*ptr == ' ')  /* skip over blanks */
         ptr++;

    if (*ptr != '\0')  /* should have reached the end of string */
    {
        ffpmsg("illegal syntax after binning weight specification in URL:");
        ffpmsg(binspec);
        *status = URL_PARSE_ERROR;
    }

    if( file_expr ) free( file_expr );

    /* If we found expressions, this is where we accumulate them into 
       something to be returned to the caller.  The start and end of
       each expression will be found in exprbeg[] and exprend[], with
       the 5th entry being the weight expression if any */
    if (has_exprs) {
      size_t nchars = 0;
      char *ptr;
      for (ii = 0; ii <= 4; ii++) {
	nchars += (exprend[ii] - exprbeg[ii]) + 1; /* null terminator */
      }
      /* Allocate storage for 5 pointers plus the characters.  Caller
         is responsible to free(*exprs) which will free both the 5-array
	 and the character string data. */
      ptr = malloc( sizeof(char *) * 5 + nchars * sizeof(char) );
      if (!ptr) {
	ffpmsg("ffbinse: memory allocation failure");
        return(*status = MEMORY_ALLOCATION);
      }
      
      (*exprs) = (char **) ptr;     /* Pointer array portion */
      ptr = (char *) (&((*exprs)[5])); /* String portion starts after the pointer array */
      for (ii = 0; ii <= 4; ii++) {
	(*exprs)[ii] = ptr;
	nchars = (exprend[ii]-exprbeg[ii]);
	strncpy(ptr, exprbeg[ii], nchars);
	ptr += nchars;
	ptr[0] = 0; /* Ensure null terminator */
	ptr ++; /* Advance to next string position */
      }
    }      
      
    return(*status);
}